

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connection.cpp
# Opt level: O2

void Am_Connection::Handle_Sockets(fd_set *readfds)

{
  Connection_List_Ptr pcVar1;
  Am_Connection_Data *pAVar2;
  int iVar3;
  ostream *poVar4;
  Connection_List_Ptr *ppcVar5;
  socklen_t i;
  sockaddr_in sa;
  
  if (num_sockets != 0) {
    ppcVar5 = &connection_list;
    while( true ) {
      pcVar1 = *ppcVar5;
      if (pcVar1 == (Connection_List_Ptr)0x0) break;
      pAVar2 = pcVar1->connection_ptr->data;
      if ((pAVar2->connected == true) &&
         (iVar3 = *(int *)&(pAVar2->super_Am_Wrapper).field_0xc,
         ((ulong)readfds->fds_bits[iVar3 / 0x40] >> ((long)iVar3 % 0x40 & 0x3fU) & 1) != 0)) {
        Handle_Input(pcVar1->connection_ptr);
      }
      ppcVar5 = &pcVar1->next;
    }
    if ((m_parent_socket != 0) &&
       ((1L << ((byte)(m_parent_socket % 0x40) & 0x3f) & readfds->fds_bits[m_parent_socket / 0x40])
        != 0)) {
      ppcVar5 = &connection_list;
      while( true ) {
        pcVar1 = *ppcVar5;
        if (pcVar1 == (Connection_List_Ptr)0x0) {
          poVar4 = std::operator<<((ostream *)&std::cerr,
                                   "C:hs: remote connection received without receiving");
          std::operator<<(poVar4,"connection waiting\n");
          std::ostream::flush();
          return;
        }
        if (pcVar1->connection_ptr->data->waiting != false) break;
        ppcVar5 = &pcVar1->next;
      }
      i = 0x10;
      iVar3 = accept(m_parent_socket,(sockaddr *)&sa,&i);
      if (iVar3 < 0) {
        perror("accept");
      }
      else {
        Set_Socket(pcVar1->connection_ptr,iVar3);
        pAVar2 = pcVar1->connection_ptr->data;
        if (pAVar2 == (Am_Connection_Data *)0x0) {
          DAT_00000011 = 0;
        }
        else {
          pAVar2->connected = true;
          pAVar2->waiting = false;
        }
      }
    }
  }
  return;
}

Assistant:

void
Am_Connection::Handle_Sockets(fd_set *readfds)
{
  if (!num_sockets)
    return;
  else {

    Connection_List_Ptr local_list;
    local_list = connection_list;
    ////
    //// Check Connections for incoming data
    ////
    while (local_list != nullptr) {
      if ((local_list->connection_ptr->Connected()) &&
          (FD_ISSET((local_list->connection_ptr->Get_Socket()), readfds))) {
        local_list->connection_ptr->Handle_Input();
      }
      local_list = local_list->next;
    }
    ////
    //// Check Parent socket for new connections
    ////
    /* This assumes that we don't need each side to specify the other.
 * The first waiting connection will get the first caller.
 * A better way might be to have the Handle sockets check the address of
 * the caller.
 */
    if ((FD_ISSET(m_parent_socket, readfds)) && (m_parent_socket != 0)) {
      local_list = connection_list;
      while ((local_list != nullptr) &&
             (!(local_list->connection_ptr->Waiting()))) {
        local_list = local_list->next;
      }
      if (local_list == nullptr)
        std::cerr << "C:hs: remote connection received without receiving"
                  << "connection waiting\n"
                  << std::flush;
      else {
        socklen_t i;
        int temp_socket;
        struct sockaddr_in sa;
        i = sizeof(sa);
        if ((temp_socket =
                 accept(m_parent_socket, (struct sockaddr *)&sa, &i)) < 0) {
          perror("accept");
        } else {
          local_list->connection_ptr->Set_Socket(temp_socket);
          local_list->connection_ptr->Set_Waiting_Flag(false);
          local_list->connection_ptr->Set_Connect_Flag(true);
        }

      } // Found new connection
    }   // someone trying to connect to parent
  }     // There is at least 1 connection
}